

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void writeJSONStreamFile(int version,Writer *jw,Stream *stream,int id,
                        qpdf_stream_decode_level_e decode_level,string *file_prefix)

{
  FILE *__stream;
  Pl_StdioFile f_pl;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_pl,
                 file_prefix,"-");
  std::__cxx11::to_string(&local_70,id);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_pl,
                 &local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&f_pl);
  __stream = (FILE *)QUtil::safe_fopen(filename._M_dataplus._M_p,"wb");
  Pl_StdioFile::Pl_StdioFile(&f_pl,"stream data",(FILE *)__stream);
  qpdf::Stream::writeStreamJSON
            (stream,version,jw,qpdf_sj_file,decode_level,&f_pl.super_Pipeline,&filename,false);
  Pl_StdioFile::finish(&f_pl);
  fclose(__stream);
  Pl_StdioFile::~Pl_StdioFile(&f_pl);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void
writeJSONStreamFile(
    int version,
    JSON::Writer& jw,
    qpdf::Stream& stream,
    int id,
    qpdf_stream_decode_level_e decode_level,
    std::string const& file_prefix)
{
    auto filename = file_prefix + "-" + std::to_string(id);
    auto* f = QUtil::safe_fopen(filename.c_str(), "wb");
    Pl_StdioFile f_pl{"stream data", f};
    stream.writeStreamJSON(version, jw, qpdf_sj_file, decode_level, &f_pl, filename);
    f_pl.finish();
    fclose(f);
}